

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_of_suite.cpp
# Opt level: O0

void any_array_boolean(void)

{
  bool bVar1;
  char *pcVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  basic_variable<std::allocator<char>_> *local_410;
  basic_variable<std::allocator<char>_> *local_3f0;
  basic_variable<std::allocator<char>_> *local_3d0;
  iterator local_3b0;
  iterator local_398;
  basic_variable<std::allocator<char>_> *local_380;
  basic_variable<std::allocator<char>_> local_378;
  basic_variable<std::allocator<char>_> local_348;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2e8 [24];
  variable data_3;
  iterator local_2a0;
  iterator local_288;
  basic_variable<std::allocator<char>_> *local_270;
  basic_variable<std::allocator<char>_> local_268;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1d8 [24];
  variable data_2;
  iterator local_190;
  iterator local_178;
  basic_variable<std::allocator<char>_> *local_160;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  basic_variable<std::allocator<char>_> local_f8;
  undefined1 local_c8 [24];
  variable data_1;
  iterator local_78;
  iterator local_50;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_50,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_78,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = std::any_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,__0>
                    (&local_50,&local_78);
  pcVar2 = "void any_array_boolean()";
  boost::detail::test_impl
            ("!std::any_of(data.begin(), data.end(), is_true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/any_of_suite.cpp"
             ,0x2e,"void any_array_boolean()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_160 = &local_158;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_160,false);
  local_160 = &local_128;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_160,false);
  local_160 = &local_f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_160,false);
  local_c8._0_8_ = &local_158;
  local_c8._8_8_ = 3;
  init._M_len = (size_type)pcVar2;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_c8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_c8._0_8_,init);
  local_3d0 = (basic_variable<std::allocator<char>_> *)local_c8;
  do {
    local_3d0 = local_3d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_3d0);
  } while (local_3d0 != &local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_178,(basic_variable<std::allocator<char>_> *)(local_c8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_190,(basic_variable<std::allocator<char>_> *)(local_c8 + 0x10));
  bVar1 = std::any_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,__0>
                    (&local_178,&local_190);
  pcVar2 = "void any_array_boolean()";
  boost::detail::test_impl
            ("!std::any_of(data.begin(), data.end(), is_true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/any_of_suite.cpp"
             ,0x32,"void any_array_boolean()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_190);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_178);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_c8 + 0x10));
  local_270 = &local_268;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_270,true);
  local_270 = &local_238;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_270,false);
  local_270 = &local_208;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_270,true);
  local_1d8._0_8_ = &local_268;
  local_1d8._8_8_ = 3;
  init_00._M_len = (size_type)pcVar2;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1d8._0_8_,init_00);
  local_3f0 = (basic_variable<std::allocator<char>_> *)local_1d8;
  do {
    local_3f0 = local_3f0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_3f0);
  } while (local_3f0 != &local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_288,(basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2a0,(basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  bVar1 = std::any_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,__0>
                    (&local_288,&local_2a0);
  pcVar2 = "void any_array_boolean()";
  boost::detail::test_impl
            ("std::any_of(data.begin(), data.end(), is_true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/any_of_suite.cpp"
             ,0x36,"void any_array_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  local_380 = &local_378;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_380,true);
  local_380 = &local_348;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_380,true);
  local_380 = &local_318;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_380,true);
  local_2e8._0_8_ = &local_378;
  local_2e8._8_8_ = 3;
  init_01._M_len = (size_type)pcVar2;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_2e8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_2e8._0_8_,init_01);
  local_410 = (basic_variable<std::allocator<char>_> *)local_2e8;
  do {
    local_410 = local_410 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_410);
  } while (local_410 != &local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_398,(basic_variable<std::allocator<char>_> *)(local_2e8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3b0,(basic_variable<std::allocator<char>_> *)(local_2e8 + 0x10));
  bVar1 = std::any_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,__0>
                    (&local_398,&local_3b0);
  boost::detail::test_impl
            ("std::any_of(data.begin(), data.end(), is_true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/any_of_suite.cpp"
             ,0x3a,"void any_array_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2e8 + 0x10));
  return;
}

Assistant:

void any_array_boolean()
{
    {
        variable data = array::make();
        TRIAL_PROTOCOL_TEST(!std::any_of(data.begin(), data.end(), is_true));
    }
    {
        variable data = array::make({ false, false, false });
        TRIAL_PROTOCOL_TEST(!std::any_of(data.begin(), data.end(), is_true));
    }
    {
        variable data = array::make({ true, false, true });
        TRIAL_PROTOCOL_TEST(std::any_of(data.begin(), data.end(), is_true));
    }
    {
        variable data = array::make({ true, true, true });
        TRIAL_PROTOCOL_TEST(std::any_of(data.begin(), data.end(), is_true));
    }
}